

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

double anon_unknown.dwarf_181bf::sampleX<float>
                 (TypedImageChannel<float> *channel,int w,double x,int y,Extrapolation ext)

{
  int a;
  int a_00;
  float *pfVar1;
  undefined4 in_ECX;
  int in_ESI;
  double in_XMM0_Qa;
  double vt;
  double vs;
  double t;
  double s;
  int xt;
  int xs;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  TypedImageChannel<float> *in_stack_ffffffffffffffa0;
  int x_00;
  double local_58;
  double local_48;
  double local_40;
  
  a = Imath_3_2::floor<double>(in_XMM0_Qa);
  a_00 = a + 1;
  local_40 = 0.0;
  local_48 = 0.0;
  x_00 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  switch(in_ECX) {
  case 0:
    if ((a < 0) || (in_ESI <= a)) {
      local_58 = 0.0;
    }
    else {
      pfVar1 = TypedImageChannel<float>::operator()
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                          in_stack_ffffffffffffff98);
      local_58 = (double)*pfVar1;
    }
    local_40 = local_58;
    if ((a_00 < 0) || (in_ESI <= a_00)) {
      local_48 = 0.0;
    }
    else {
      pfVar1 = TypedImageChannel<float>::operator()
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                          in_stack_ffffffffffffff98);
      local_48 = (double)*pfVar1;
    }
    break;
  case 1:
    Imath_3_2::clamp<int>(a,0,in_ESI + -1);
    Imath_3_2::clamp<int>(a_00,0,in_ESI + -1);
    pfVar1 = TypedImageChannel<float>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    local_40 = (double)*pfVar1;
    pfVar1 = TypedImageChannel<float>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    local_48 = (double)*pfVar1;
    break;
  case 2:
    Imath_3_2::modp(x_00,(int)in_stack_ffffffffffffffa0);
    Imath_3_2::modp((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
    pfVar1 = TypedImageChannel<float>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    local_40 = (double)*pfVar1;
    pfVar1 = TypedImageChannel<float>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    local_48 = (double)*pfVar1;
    break;
  case 3:
    mirror(x_00,(int)in_stack_ffffffffffffffa0);
    mirror((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
    pfVar1 = TypedImageChannel<float>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    local_40 = (double)*pfVar1;
    pfVar1 = TypedImageChannel<float>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    local_48 = (double)*pfVar1;
  }
  return ((double)a_00 - in_XMM0_Qa) * local_40 + (1.0 - ((double)a_00 - in_XMM0_Qa)) * local_48;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}